

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O2

void Ssw_SmlSavePatternAigPhase(Ssw_Man_t *p,int f)

{
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar1;
  void *pvVar2;
  uint i;
  
  memset(p->pPatWords,0,(long)p->nPatWords << 2);
  for (i = 0; p_00 = p->pAig->vCis, (int)i < p_00->nSize; i = i + 1) {
    pvVar2 = Vec_PtrEntry(p_00,i);
    pAVar1 = p->pNodeToFrames[*(int *)((long)pvVar2 + 0x24) * p->nFrames + f];
    if ((pAVar1 == (Aig_Obj_t *)0x0) ||
       ((((uint)pAVar1 ^ *(uint *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x18) >> 3) & 1) != 0)) {
      p->pPatWords[i >> 5] = p->pPatWords[i >> 5] | 1 << ((byte)i & 0x1f);
    }
  }
  return;
}

Assistant:

void Ssw_SmlSavePatternAigPhase( Ssw_Man_t * p, int f )
{
    Aig_Obj_t * pObj;
    int i;
    memset( p->pPatWords, 0, sizeof(unsigned) * p->nPatWords );
    Aig_ManForEachCi( p->pAig, pObj, i )
        if ( Aig_ObjPhaseReal( Ssw_ObjFrame(p, pObj, f) ) )
            Abc_InfoSetBit( p->pPatWords, i );
}